

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_inout(lysp_yang_ctx *ctx,ly_stmt inout_kw,lysp_node *parent,
                  lysp_node_action_inout *inout_p)

{
  lysp_node **siblings;
  lyd_node *plVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *pcVar4;
  char *format;
  lysp_restr **extraout_RDX;
  lysp_restr **extraout_RDX_00;
  lysp_restr **restrs;
  lysp_restr **extraout_RDX_01;
  lysp_restr **extraout_RDX_02;
  ly_ctx *plVar5;
  ly_stmt stmt;
  bool bVar6;
  ly_stmt kw;
  size_t word_len;
  char *word;
  lysp_ext_instance **local_50;
  lysp_restr **local_48;
  lysp_tpdf **local_40;
  lysp_node_grp **local_38;
  
  if ((inout_p->field_0).node.nodetype != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar3 = lyplg_ext_stmt2str(inout_kw);
    pcVar4 = "Duplicate keyword \"%s\".";
LAB_00170577:
    ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,pcVar4,pcVar3);
    return LY_EVALID;
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar5 = (ly_ctx *)0x0;
  }
  else {
    plVar5 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  pcVar3 = "output";
  if ((lysp_node_action_inout *)&parent[1].next == inout_p) {
    pcVar3 = "input";
  }
  LVar2 = lydict_insert(plVar5,pcVar3,0,&(inout_p->field_0).node.name);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  (inout_p->field_0).node.nodetype =
       (ushort)((lysp_node_action_inout *)&parent[1].next != inout_p) * 0x1000 + 0x1000;
  (inout_p->field_0).node.parent = parent;
  LVar2 = get_keyword(ctx,&kw,&word,&word_len);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (kw == LY_STMT_SYNTAX_SEMICOLON) {
    bVar6 = false;
    restrs = extraout_RDX;
  }
  else {
    if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar5 = (ly_ctx *)0x0;
      }
      else {
        plVar5 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar3 = lyplg_ext_stmt2str(kw);
      pcVar4 = "Invalid keyword \"%s\", expected \";\" or \"{\".";
      goto LAB_00170577;
    }
    LVar2 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    bVar6 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
    restrs = extraout_RDX_00;
  }
  local_50 = &(inout_p->field_0).node.exts;
  local_38 = &inout_p->groupings;
  local_48 = &inout_p->musts;
  local_40 = &inout_p->typedefs;
  siblings = &inout_p->child;
  stmt = kw;
  do {
    if (!bVar6) {
      return LY_SUCCESS;
    }
    if (stmt == LY_STMT_TYPEDEF) {
      LVar2 = parse_typedef(ctx,(lysp_node *)inout_p,local_40);
    }
    else if (stmt == LY_STMT_ANYXML) {
LAB_00170709:
      LVar2 = parse_any(ctx,stmt,(lysp_node *)inout_p,siblings);
    }
    else if (stmt == LY_STMT_CHOICE) {
      LVar2 = parse_choice(ctx,(lysp_node *)inout_p,siblings);
    }
    else if (stmt == LY_STMT_CONTAINER) {
      LVar2 = parse_container(ctx,(lysp_node *)inout_p,siblings);
    }
    else if (stmt == LY_STMT_GROUPING) {
      LVar2 = parse_grouping(ctx,(lysp_node *)inout_p,local_38);
    }
    else if (stmt == LY_STMT_LEAF) {
      LVar2 = parse_leaf(ctx,(lysp_node *)inout_p,siblings);
    }
    else if (stmt == LY_STMT_LEAF_LIST) {
      LVar2 = parse_leaflist(ctx,(lysp_node *)inout_p,siblings);
    }
    else if (stmt == LY_STMT_LIST) {
      LVar2 = parse_list(ctx,(lysp_node *)inout_p,siblings);
    }
    else if (stmt == LY_STMT_USES) {
      LVar2 = parse_uses(ctx,(lysp_node *)inout_p,siblings);
    }
    else {
      if (stmt != LY_STMT_EXTENSION_INSTANCE) {
        if (stmt == LY_STMT_MUST) {
          plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          if (1 < *(byte *)&plVar1[2].schema) {
            LVar2 = parse_restrs(ctx,(ly_stmt)local_48,restrs);
            goto LAB_001707ff;
          }
          plVar5 = (ly_ctx *)**(undefined8 **)plVar1;
          pcVar4 = lyplg_ext_stmt2str(inout_kw);
          pcVar3 = "must";
        }
        else {
          if (stmt != LY_STMT_ANYDATA) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar5 = (ly_ctx *)0x0;
            }
            else {
              plVar5 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar3 = lyplg_ext_stmt2str(stmt);
            pcVar4 = lyplg_ext_stmt2str(inout_kw);
            format = "Invalid keyword \"%s\" as a child of \"%s\".";
            goto LAB_00170930;
          }
          plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          if (1 < *(byte *)&plVar1[2].schema) goto LAB_00170709;
          plVar5 = (ly_ctx *)**(undefined8 **)plVar1;
          pcVar4 = lyplg_ext_stmt2str(inout_kw);
          pcVar3 = "anydata";
        }
        format = 
        "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
        ;
LAB_00170930:
        ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar3,pcVar4);
        return LY_EVALID;
      }
      LVar2 = parse_ext(ctx,word,word_len,inout_p,inout_kw,0,local_50);
    }
LAB_001707ff:
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    LVar2 = get_keyword(ctx,&kw,&word,&word_len);
    stmt = kw;
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    bVar6 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
    restrs = extraout_RDX_01;
    if (((!bVar6) && (*local_50 != (lysp_ext_instance *)0x0)) &&
       (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*local_50,'\x01',(uint32_t *)0x0),
       restrs = extraout_RDX_02, LVar2 != LY_SUCCESS)) {
      return LVar2;
    }
  } while( true );
}

Assistant:

static LY_ERR
parse_inout(struct lysp_yang_ctx *ctx, enum ly_stmt inout_kw, struct lysp_node *parent,
        struct lysp_node_action_inout *inout_p)
{
    LY_ERR ret = LY_SUCCESS;
    char *word;
    size_t word_len;
    enum ly_stmt kw;
    ly_bool input = &((struct lysp_node_action *)parent)->input == inout_p ? 1 : 0;

    if (inout_p->nodetype) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(inout_kw));
        return LY_EVALID;
    }

    /* initiate structure */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), input ? "input" : "output", 0, &inout_p->name));
    inout_p->nodetype = input ? LYS_INPUT : LYS_OUTPUT;
    inout_p->parent = parent;

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", lyplg_ext_stmt2str(inout_kw));
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)inout_p, &inout_p->child));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)inout_p, &inout_p->typedefs));
            break;
        case LY_STMT_MUST:
            PARSER_CHECK_STMTVER2_RET(ctx, "must", lyplg_ext_stmt2str(inout_kw));
            LY_CHECK_RET(parse_restrs(ctx, kw, &inout_p->musts));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)inout_p, &inout_p->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, inout_p, inout_kw, 0, &inout_p->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(inout_kw));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, inout_p->exts, ret, cleanup);
    }

cleanup:
    return ret;
}